

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeIndexMoveto(BtCursor *pCur,UnpackedRecord *pIdxKey,int *pRes)

{
  MemPage **ppPage;
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  KeyInfo *pKVar7;
  anon_union_8_2_94730112_for_u *paVar8;
  MemPage *pMVar9;
  u8 *puVar10;
  bool bVar11;
  char cVar12;
  int iVar13;
  uchar *pBuf;
  byte *pbVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  i8 iVar18;
  i8 iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int unaff_R14D;
  u32 amt;
  int local_74;
  RecordCompare local_60;
  int local_58;
  int local_54;
  
  pKVar7 = pIdxKey->pKeyInfo;
  if (pKVar7->nAllField < 0xe) {
    paVar8 = (anon_union_8_2_94730112_for_u *)pIdxKey->aMem;
    uVar6 = *(u16 *)((long)paVar8 + 0x14);
    if (*pKVar7->aSortFlags == 0) {
      iVar18 = '\x01';
      iVar19 = -1;
LAB_00145f42:
      pIdxKey->r1 = iVar19;
      pIdxKey->r2 = iVar18;
      if ((uVar6 & 4) != 0) {
        pIdxKey->u = *paVar8;
        local_60 = vdbeRecordCompareInt;
        goto LAB_00145f7e;
      }
      bVar11 = true;
      if (((uVar6 & 0x39) == 0) && (pKVar7->aColl[0] == (CollSeq *)0x0)) {
        pIdxKey->u = paVar8[1];
        pIdxKey->n = *(int *)(paVar8 + 2);
        local_60 = vdbeRecordCompareString;
        goto LAB_00145f7e;
      }
    }
    else {
      if ((*pKVar7->aSortFlags & 2) == 0) {
        iVar18 = -1;
        iVar19 = '\x01';
        goto LAB_00145f42;
      }
      local_60 = sqlite3VdbeRecordCompare;
LAB_00145f7e:
      bVar11 = false;
    }
    if (bVar11) goto LAB_00145f8a;
  }
  else {
LAB_00145f8a:
    local_60 = sqlite3VdbeRecordCompare;
  }
  pIdxKey->errCode = '\0';
  local_58 = unaff_R14D;
  if ((pCur->eState == '\0') && (pCur->pPage->leaf != '\0')) {
    if (0 < (long)pCur->iPage) {
      lVar15 = 0;
      do {
        if (pCur->aiIdx[lVar15] < pCur->apPage[lVar15]->nCell) goto LAB_00145fa4;
        lVar15 = lVar15 + 1;
      } while (pCur->iPage != lVar15);
    }
    if (((pCur->pPage->nCell - 1 == (uint)pCur->ix) &&
        (iVar13 = indexCellCompare(pCur,(uint)pCur->ix,pIdxKey,local_60), iVar13 < 1)) &&
       (pIdxKey->errCode == '\0')) {
      *pRes = iVar13;
      unaff_R14D = 0;
LAB_00146582:
      iVar13 = 1;
    }
    else if (((pCur->iPage < '\x01') ||
             (iVar13 = indexCellCompare(pCur,0,pIdxKey,local_60), 0 < iVar13)) ||
            (pIdxKey->errCode != '\0')) {
      pIdxKey->errCode = '\0';
      iVar13 = 0;
    }
    else {
      pCur->curFlags = pCur->curFlags & 0xfb;
      if (pCur->pPage->isInit == '\0') {
        unaff_R14D = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12af9);
        goto LAB_00146582;
      }
      iVar13 = 2;
    }
    local_58 = unaff_R14D;
    if (iVar13 == 2) goto LAB_00146084;
    if (iVar13 != 0) {
      return unaff_R14D;
    }
  }
LAB_00145fa4:
  iVar13 = moveToRoot(pCur);
  if (iVar13 != 0) {
    if (iVar13 != 0x10) {
      return iVar13;
    }
    *pRes = -1;
    return 0;
  }
LAB_00146084:
  ppPage = &pCur->pPage;
  local_74 = 0;
  local_54 = local_58;
  do {
    pMVar9 = *ppPage;
    iVar13 = pMVar9->nCell - 1;
    iVar22 = iVar13 >> 1;
    iVar21 = 0;
    do {
      puVar10 = pMVar9->aDataOfst;
      uVar16 = (ulong)(CONCAT11(pMVar9->aCellIdx[(long)iVar22 * 2],
                                pMVar9->aCellIdx[(long)iVar22 * 2 + 1]) & pMVar9->maskPage);
      pbVar14 = puVar10 + uVar16;
      bVar2 = *pbVar14;
      if (pMVar9->max1bytePayload < bVar2) {
        bVar3 = pbVar14[1];
        if ((-1 < (char)bVar3) &&
           (uVar20 = (bVar2 & 0x7f) << 7 | (int)(char)bVar3, uVar20 <= pMVar9->maxLocal)) {
          local_54 = (*local_60)(uVar20,puVar10 + uVar16 + 2,pIdxKey);
          goto LAB_00146289;
        }
        (*pMVar9->xParseCell)(pMVar9,puVar10 + (uVar16 - pMVar9->childPtrSize),&pCur->info);
        uVar16 = (pCur->info).nKey;
        amt = (u32)uVar16;
        if (((int)amt < 2) ||
           (pCur->pBt->nPage < (uint)((uVar16 & 0xffffffff) / (ulong)pCur->pBt->usableSize))) {
          bVar11 = false;
          local_74 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12b50,
                      "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
          iVar17 = 7;
        }
        else {
          pBuf = (uchar *)sqlite3Malloc((ulong)(amt + 0x12));
          iVar17 = 7;
          if (pBuf == (uchar *)0x0) {
            bVar11 = false;
            local_74 = 7;
          }
          else {
            pCur->ix = (u16)iVar22;
            local_74 = accessPayload(pCur,0,amt,pBuf,0);
            puVar1 = pBuf + (amt & 0x7fffffff);
            puVar1[0] = '\0';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            puVar1[4] = '\0';
            puVar1[5] = '\0';
            puVar1[6] = '\0';
            puVar1[7] = '\0';
            puVar1[8] = '\0';
            puVar1[9] = '\0';
            puVar1[10] = '\0';
            puVar1[0xb] = '\0';
            puVar1[0xc] = '\0';
            puVar1[0xd] = '\0';
            puVar1[0xe] = '\0';
            puVar1[0xf] = '\0';
            (pBuf + (ulong)(amt & 0x7fffffff) + 0x10)[0] = '\0';
            (pBuf + (ulong)(amt & 0x7fffffff) + 0x10)[1] = '\0';
            pCur->curFlags = pCur->curFlags & 0xfb;
            if (local_74 == 0) {
              iVar17 = 0;
              local_54 = sqlite3VdbeRecordCompareWithSkip(amt,pBuf,pIdxKey,0);
              sqlite3_free(pBuf);
              bVar11 = true;
              local_74 = 0;
            }
            else {
              sqlite3_free(pBuf);
              bVar11 = false;
            }
          }
        }
        if (bVar11) goto LAB_00146289;
      }
      else {
        local_54 = (*local_60)((int)bVar2,pbVar14 + 1,pIdxKey);
LAB_00146289:
        if (local_54 < 0) {
          iVar21 = iVar22 + 1;
        }
        else {
          if (local_54 == 0) {
            *pRes = 0;
            pCur->ix = (u16)iVar22;
            iVar17 = 7;
            if (pIdxKey->errCode == '\0') {
              local_54 = 0;
              local_74 = 0;
            }
            else {
              local_54 = 0;
              local_74 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12b70,
                          "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
            }
            goto LAB_0014631b;
          }
          iVar13 = iVar22 + -1;
        }
        iVar17 = 5;
        if (iVar21 <= iVar13) {
          iVar22 = iVar21 + iVar13 >> 1;
          iVar17 = 0;
        }
      }
LAB_0014631b:
    } while (iVar17 == 0);
    if (iVar17 == 5) {
      if (pMVar9->leaf == '\0') {
        if (iVar21 < (int)(uint)pMVar9->nCell) {
          lVar15 = (ulong)(CONCAT11(pMVar9->aCellIdx[(long)iVar21 * 2],
                                    pMVar9->aCellIdx[(long)iVar21 * 2 + 1]) & pMVar9->maskPage) + 3;
        }
        else {
          lVar15 = (ulong)pMVar9->hdrOffset + 0xb;
        }
        pbVar14 = pMVar9->aData + lVar15;
        bVar2 = pbVar14[-3];
        bVar3 = pbVar14[-2];
        bVar4 = pbVar14[-1];
        bVar5 = *pbVar14;
        (pCur->info).nSize = 0;
        pCur->curFlags = pCur->curFlags & 0xf9;
        cVar12 = pCur->iPage;
        lVar15 = (long)cVar12;
        if (lVar15 < 0x13) {
          pCur->aiIdx[lVar15] = (u16)iVar21;
          pCur->apPage[lVar15] = pCur->pPage;
          pCur->ix = 0;
          pCur->iPage = cVar12 + '\x01';
          local_74 = getAndInitPage(pCur->pBt,
                                    (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar2 << 0x18 |
                                    (uint)bVar5,ppPage,(uint)pCur->curPagerFlags);
          if ((local_74 == 0) &&
             ((pMVar9 = *ppPage, pMVar9->nCell == 0 ||
              (local_74 = 0, pMVar9->intKey != pCur->curIntKey)))) {
            if (pMVar9 != (MemPage *)0x0) {
              sqlite3PagerUnrefNotNull(pMVar9->pDbPage);
            }
            local_74 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12b9a);
          }
          if (local_74 == 0) {
            iVar17 = 0;
            local_74 = 0;
          }
          else {
            cVar12 = pCur->iPage + -1;
            pCur->iPage = cVar12;
            pCur->pPage = pCur->apPage[cVar12];
            iVar17 = 3;
          }
        }
        else {
          local_58 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12b8f);
          iVar17 = 1;
        }
      }
      else {
        pCur->ix = (u16)iVar22;
        *pRes = local_54;
        local_74 = 0;
        iVar17 = 7;
      }
    }
    if (iVar17 != 0) {
      if ((iVar17 == 7) || (iVar17 == 3)) {
        (pCur->info).nSize = 0;
        local_58 = local_74;
      }
      return local_58;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeIndexMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo!=0 );

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
  pIdxKey->errCode = 0;
  assert( pIdxKey->default_rc==1
       || pIdxKey->default_rc==0
       || pIdxKey->default_rc==-1
  );


  /* Check to see if we can skip a lot of work.  Two cases:
  **
  **    (1) If the cursor is already pointing to the very last cell
  **        in the table and the pIdxKey search key is greater than or
  **        equal to that last cell, then no movement is required.
  **
  **    (2) If the cursor is on the last page of the table and the first
  **        cell on that last page is less than or equal to the pIdxKey
  **        search key, then we can start the search on the current page
  **        without needing to go back to root.
  */
  if( pCur->eState==CURSOR_VALID
   && pCur->pPage->leaf
   && cursorOnLastPage(pCur)
  ){
    int c;
    if( pCur->ix==pCur->pPage->nCell-1
     && (c = indexCellCompare(pCur, pCur->ix, pIdxKey, xRecordCompare))<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      *pRes = c;
      return SQLITE_OK;  /* Cursor already pointing at the correct spot */
    }
    if( pCur->iPage>0
     && indexCellCompare(pCur, 0, pIdxKey, xRecordCompare)<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      pCur->curFlags &= ~BTCF_ValidOvfl;
      if( !pCur->pPage->isInit ){
        return SQLITE_CORRUPT_BKPT;
      }
      goto bypass_moveto_root;  /* Start search on the current page */
    }
    pIdxKey->errCode = SQLITE_OK;
  }

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }

bypass_moveto_root:
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->curIntKey==0 );
  assert( pIdxKey!=0 );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==0 );
    lwr = 0;
    upr = pPage->nCell-1;
    idx = upr>>1; /* idx = (lwr+upr)/2; */
    for(;;){
      int nCell;  /* Size of the pCell cell in bytes */
      pCell = findCellPastPtr(pPage, idx);

      /* The maximum supported page-size is 65536 bytes. This means that
      ** the maximum number of record bytes stored on an index B-Tree
      ** page is less than 16384 bytes and may be stored as a 2-byte
      ** varint. This information is used to attempt to avoid parsing
      ** the entire cell by checking for the cases where the record is
      ** stored entirely within the b-tree page by inspecting the first
      ** 2 bytes of the cell.
      */
      nCell = pCell[0];
      if( nCell<=pPage->max1bytePayload ){
        /* This branch runs if the record-size field of the cell is a
        ** single byte varint and the record fits entirely on the main
        ** b-tree page.  */
        testcase( pCell+nCell+1==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
      }else if( !(pCell[1] & 0x80)
        && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
      ){
        /* The record-size field is a 2 byte varint and the record
        ** fits entirely on the main b-tree page.  */
        testcase( pCell+nCell+2==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
      }else{
        /* The record flows over onto one or more overflow pages. In
        ** this case the whole cell needs to be parsed, a buffer allocated
        ** and accessPayload() used to retrieve the record into the
        ** buffer before VdbeRecordCompare() can be called.
        **
        ** If the record is corrupt, the xRecordCompare routine may read
        ** up to two varints past the end of the buffer. An extra 18
        ** bytes of padding is allocated at the end of the buffer in
        ** case this happens.  */
        void *pCellKey;
        u8 * const pCellBody = pCell - pPage->childPtrSize;
        const int nOverrun = 18;  /* Size of the overrun padding */
        pPage->xParseCell(pPage, pCellBody, &pCur->info);
        nCell = (int)pCur->info.nKey;
        testcase( nCell<0 );   /* True if key size is 2^32 or more */
        testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
        testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
        testcase( nCell==2 );  /* Minimum legal index key size */
        if( nCell<2 || nCell/pCur->pBt->usableSize>pCur->pBt->nPage ){
          rc = SQLITE_CORRUPT_PAGE(pPage);
          goto moveto_index_finish;
        }
        pCellKey = sqlite3Malloc( nCell+nOverrun );
        if( pCellKey==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto moveto_index_finish;
        }
        pCur->ix = (u16)idx;
        rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
        memset(((u8*)pCellKey)+nCell,0,nOverrun); /* Fix uninit warnings */
        pCur->curFlags &= ~BTCF_ValidOvfl;
        if( rc ){
          sqlite3_free(pCellKey);
          goto moveto_index_finish;
        }
        c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
        sqlite3_free(pCellKey);
      }
      assert(
          (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
       && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
      );
      if( c<0 ){
        lwr = idx+1;
      }else if( c>0 ){
        upr = idx-1;
      }else{
        assert( c==0 );
        *pRes = 0;
        rc = SQLITE_OK;
        pCur->ix = (u16)idx;
        if( pIdxKey->errCode ) rc = SQLITE_CORRUPT_BKPT;
        goto moveto_index_finish;
      }
      if( lwr>upr ) break;
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell || CORRUPT_DB );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_index_finish;
    }
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }

    /* This block is similar to an in-lined version of:
    **
    **    pCur->ix = (u16)lwr;
    **    rc = moveToChild(pCur, chldPg);
    **    if( rc ) break;
    */
    pCur->info.nSize = 0;
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
    if( pCur->iPage>=(BTCURSOR_MAX_DEPTH-1) ){
      return SQLITE_CORRUPT_BKPT;
    }
    pCur->aiIdx[pCur->iPage] = (u16)lwr;
    pCur->apPage[pCur->iPage] = pCur->pPage;
    pCur->ix = 0;
    pCur->iPage++;
    rc = getAndInitPage(pCur->pBt, chldPg, &pCur->pPage, pCur->curPagerFlags);
    if( rc==SQLITE_OK
     && (pCur->pPage->nCell<1 || pCur->pPage->intKey!=pCur->curIntKey)
    ){
      releasePage(pCur->pPage);
      rc = SQLITE_CORRUPT_PGNO(chldPg);
    }
    if( rc ){
      pCur->pPage = pCur->apPage[--pCur->iPage];
      break;
    }
    /*
    ***** End of in-lined moveToChild() call */
 }
moveto_index_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}